

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2pointutil.cc
# Opt level: O2

bool S2::IsUnitLength(S2Point *p)

{
  double dVar1;
  
  dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)p);
  return ABS(dVar1 + -1.0) <= 1.1102230246251565e-15;
}

Assistant:

bool IsUnitLength(const S2Point& p) {
  // Normalize() is guaranteed to return a vector whose L2-norm differs from 1
  // by less than 2 * DBL_EPSILON.  Thus the squared L2-norm differs by less
  // than 4 * DBL_EPSILON.  The actual calculated Norm2() can have up to 1.5 *
  // DBL_EPSILON of additional error.  The total error of 5.5 * DBL_EPSILON
  // can then be rounded down since the result must be a representable
  // double-precision value.
  return fabs(p.Norm2() - 1) <= 5 * DBL_EPSILON;  // About 1.11e-15
}